

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptRegularExpression.cpp
# Opt level: O2

bool Js::JavascriptRegExp::HasObservableUnicodeFlag(DynamicObject *regexPrototype)

{
  JavascriptLibrary *pJVar1;
  ThreadConfiguration *pTVar2;
  JavascriptFunction *pJVar3;
  bool bVar4;
  
  pJVar1 = (((regexPrototype->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr;
  pTVar2 = (((pJVar1->super_JavascriptLibraryBase).scriptContext.ptr)->config).threadConfig;
  if ((pTVar2->m_ES6Unicode == true) && (pTVar2->m_ES6RegExPrototypeProperties == true)) {
    pJVar3 = (JavascriptFunction *)
             DynamicObject::GetSlot(regexPrototype,pJVar1->regexUnicodeGetterSlotIndex);
    bVar4 = pJVar3 != (pJVar1->regexUnicodeGetterFunction).ptr;
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool JavascriptRegExp::HasObservableUnicodeFlag(DynamicObject* regexPrototype)
    {
        const ScriptConfiguration* scriptConfig = regexPrototype->GetScriptContext()->GetConfig();
        JavascriptLibrary* library = regexPrototype->GetLibrary();
        return scriptConfig->IsES6UnicodeExtensionsEnabled()
            && scriptConfig->IsES6RegExPrototypePropertiesEnabled()
            && regexPrototype->GetSlot(library->GetRegexUnicodeGetterSlotIndex()) != library->GetRegexUnicodeGetterFunction();
    }